

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O2

bool operator==(cmLinkItem *l,cmLinkItem *r)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (l->Target != r->Target) {
    return false;
  }
  __n = (l->String)._M_string_length;
  if (__n == (r->String)._M_string_length) {
    iVar1 = std::char_traits<char>::compare
                      ((l->String)._M_dataplus._M_p,(r->String)._M_dataplus._M_p,__n);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool operator==(cmLinkItem const& l, cmLinkItem const& r)
{
  return l.Target == r.Target && l.String == r.String;
}